

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall
Catch::StringMaker<float,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<float,void> *this,float value)

{
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar1;
  size_t sVar2;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  long lVar6;
  ReusableStringStream rss;
  undefined4 *local_68;
  ulong local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  ReusableStringStream local_48;
  long *local_38 [2];
  long local_28 [2];
  
  if (NAN(value)) {
    local_68 = &local_58;
    local_58 = 0x6e616e;
    local_60 = 3;
  }
  else {
    lVar6 = (long)precision;
    pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    sVar2 = StringStreams::add(&pSVar1->super_StringStreams);
    local_48.m_index = sVar2;
    pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    local_48.m_oss =
         (ostream *)
         (pSVar1->super_StringStreams).m_streams.
         super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar2].m_ptr;
    lVar3 = *(long *)local_48.m_oss;
    *(long *)((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_48.m_oss + *(long *)(lVar3 + -0x18) + 8) = lVar6;
    lVar3 = *(long *)(lVar3 + -0x18);
    *(uint *)((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_48.m_oss + lVar3 + 0x18) =
         *(uint *)((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48.m_oss + lVar3 + 0x18) & 0xfffffefb | 4;
    std::ostream::_M_insert<double>((double)value);
    std::__cxx11::stringbuf::str();
    lVar3 = std::__cxx11::string::find_last_not_of((char)&local_68,0x30);
    if ((lVar3 != -1) && (lVar3 != local_60 - 1)) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)&local_68);
      std::__cxx11::string::operator=((string *)&local_68,(string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
    ReusableStringStream::~ReusableStringStream(&local_48);
  }
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_68,local_60,0,'\x01');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT44(uStack_54,local_58) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<float>::convert(float value) {
        return Detail::fpToString(value, precision) + 'f';
    }